

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtabwidget.cpp
# Opt level: O2

void __thiscall QTabWidget::paintEvent(QTabWidget *this,QPaintEvent *param_1)

{
  long lVar1;
  QWidget *pQVar2;
  QTabBar *pQVar3;
  bool bVar4;
  int iVar5;
  QSize QVar6;
  long lVar7;
  long in_FS_OFFSET;
  QStylePainter local_d8;
  QStyleOptionTabWidgetFrame opt;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  lVar7 = *(long *)&(this->super_QWidget).field_0x8;
  bVar4 = documentMode(this);
  if (bVar4) {
    bVar4 = QTabBar::drawBase(*(QTabBar **)(lVar7 + 600));
    if (!bVar4) goto LAB_0046ac7f;
    local_d8.wstyle = (QStyle *)&DAT_aaaaaaaaaaaaaaaa;
    local_d8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_d8.widget = (QWidget *)&DAT_aaaaaaaaaaaaaaaa;
    QStylePainter::QStylePainter
              (&local_d8,&(this->super_QWidget).super_QPaintDevice,
               *(QWidget **)(*(long *)&(this->super_QWidget).field_0x8 + 600));
    lVar7 = *(long *)&(this->super_QWidget).field_0x8;
    pQVar2 = *(QWidget **)(lVar7 + 0x288);
    if ((pQVar2 != (QWidget *)0x0) && ((pQVar2->data->widget_attributes & 0x8000) != 0)) {
      opt._96_8_ = &DAT_aaaaaaaaaaaaaaaa;
      opt._80_8_ = &DAT_aaaaaaaaaaaaaaaa;
      opt._88_8_ = &DAT_aaaaaaaaaaaaaaaa;
      opt._64_8_ = &DAT_aaaaaaaaaaaaaaaa;
      opt._72_8_ = &DAT_aaaaaaaaaaaaaaaa;
      opt.super_QStyleOption.palette._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      opt.super_QStyleOption.styleObject = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
      opt.super_QStyleOption._32_8_ = &DAT_aaaaaaaaaaaaaaaa;
      opt.super_QStyleOption.palette.d = (QPalettePrivate *)&DAT_aaaaaaaaaaaaaaaa;
      opt.super_QStyleOption.rect._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      opt.super_QStyleOption.rect._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      opt.super_QStyleOption._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      opt.super_QStyleOption._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      QStyleOptionTabBarBase::QStyleOptionTabBarBase((QStyleOptionTabBarBase *)&opt);
      pQVar3 = *(QTabBar **)(*(long *)&(this->super_QWidget).field_0x8 + 600);
      QVar6 = QWidget::size(pQVar2);
      QTabBarPrivate::initStyleBaseOption((QStyleOptionTabBarBase *)&opt,pQVar3,QVar6);
      iVar5 = QWidget::x(pQVar2);
      opt.super_QStyleOption.rect.x2.m_i = opt.super_QStyleOption.rect.x2.m_i + iVar5;
      opt.super_QStyleOption.rect.x1.m_i = opt.super_QStyleOption.rect.x1.m_i + iVar5;
      iVar5 = QWidget::y(pQVar2);
      opt.super_QStyleOption.rect.y2.m_i = opt.super_QStyleOption.rect.y2.m_i + iVar5;
      opt.super_QStyleOption.rect.y1.m_i = opt.super_QStyleOption.rect.y1.m_i + iVar5;
      QStylePainter::drawPrimitive(&local_d8,PE_FrameTabBarBase,&opt.super_QStyleOption);
      QStyleOption::~QStyleOption(&opt.super_QStyleOption);
      lVar7 = *(long *)&(this->super_QWidget).field_0x8;
    }
    pQVar2 = *(QWidget **)(lVar7 + 0x290);
    if ((pQVar2 != (QWidget *)0x0) && ((pQVar2->data->widget_attributes & 0x8000) != 0)) {
      opt._96_8_ = &DAT_aaaaaaaaaaaaaaaa;
      opt._80_8_ = &DAT_aaaaaaaaaaaaaaaa;
      opt._88_8_ = &DAT_aaaaaaaaaaaaaaaa;
      opt._64_8_ = &DAT_aaaaaaaaaaaaaaaa;
      opt._72_8_ = &DAT_aaaaaaaaaaaaaaaa;
      opt.super_QStyleOption.palette._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      opt.super_QStyleOption.styleObject = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
      opt.super_QStyleOption._32_8_ = &DAT_aaaaaaaaaaaaaaaa;
      opt.super_QStyleOption.palette.d = (QPalettePrivate *)&DAT_aaaaaaaaaaaaaaaa;
      opt.super_QStyleOption.rect._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      opt.super_QStyleOption.rect._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      opt.super_QStyleOption._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      opt.super_QStyleOption._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      QStyleOptionTabBarBase::QStyleOptionTabBarBase((QStyleOptionTabBarBase *)&opt);
      pQVar3 = *(QTabBar **)(*(long *)&(this->super_QWidget).field_0x8 + 600);
      QVar6 = QWidget::size(pQVar2);
      QTabBarPrivate::initStyleBaseOption((QStyleOptionTabBarBase *)&opt,pQVar3,QVar6);
      iVar5 = QWidget::x(pQVar2);
      opt.super_QStyleOption.rect.x2.m_i = opt.super_QStyleOption.rect.x2.m_i + iVar5;
      opt.super_QStyleOption.rect.x1.m_i = opt.super_QStyleOption.rect.x1.m_i + iVar5;
      iVar5 = QWidget::y(pQVar2);
      opt.super_QStyleOption.rect.y2.m_i = opt.super_QStyleOption.rect.y2.m_i + iVar5;
      opt.super_QStyleOption.rect.y1.m_i = opt.super_QStyleOption.rect.y1.m_i + iVar5;
      QStylePainter::drawPrimitive(&local_d8,PE_FrameTabBarBase,&opt.super_QStyleOption);
      QStyleOption::~QStyleOption(&opt.super_QStyleOption);
    }
  }
  else {
    local_d8.wstyle = (QStyle *)&DAT_aaaaaaaaaaaaaaaa;
    local_d8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_d8.widget = (QWidget *)&DAT_aaaaaaaaaaaaaaaa;
    QStylePainter::QStylePainter(&local_d8,&this->super_QWidget);
    memset(&opt,0xaa,0x88);
    QStyleOptionTabWidgetFrame::QStyleOptionTabWidgetFrame(&opt);
    (**(code **)(*(long *)&this->super_QWidget + 0x1b0))(this,&opt);
    opt.super_QStyleOption.rect._0_8_ = *(undefined8 *)(lVar7 + 0x268);
    opt.super_QStyleOption.rect._8_8_ = *(undefined8 *)(lVar7 + 0x270);
    QStylePainter::drawPrimitive(&local_d8,PE_FrameTabWidget,&opt.super_QStyleOption);
    QStyleOption::~QStyleOption(&opt.super_QStyleOption);
  }
  QPainter::~QPainter(&local_d8.super_QPainter);
LAB_0046ac7f:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QTabWidget::paintEvent(QPaintEvent *)
{
    Q_D(QTabWidget);
    if (documentMode()) {
        if (d->tabs->drawBase()) {
            QStylePainter p(this, tabBar());
            if (QWidget *w = cornerWidget(Qt::TopLeftCorner); w && w->isVisible()) {
                QStyleOptionTabBarBase opt;
                QTabBarPrivate::initStyleBaseOption(&opt, tabBar(), w->size());
                opt.rect.moveLeft(w->x() + opt.rect.x());
                opt.rect.moveTop(w->y() + opt.rect.y());
                p.drawPrimitive(QStyle::PE_FrameTabBarBase, opt);
            }
            if (QWidget *w = cornerWidget(Qt::TopRightCorner); w && w->isVisible()) {
                QStyleOptionTabBarBase opt;
                QTabBarPrivate::initStyleBaseOption(&opt, tabBar(), w->size());
                opt.rect.moveLeft(w->x() + opt.rect.x());
                opt.rect.moveTop(w->y() + opt.rect.y());
                p.drawPrimitive(QStyle::PE_FrameTabBarBase, opt);
            }
        }
        return;
    }
    QStylePainter p(this);

    QStyleOptionTabWidgetFrame opt;
    initStyleOption(&opt);
    opt.rect = d->panelRect;
    p.drawPrimitive(QStyle::PE_FrameTabWidget, opt);
}